

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

void button_binding_ungrab(natwm_state *state,xcb_window_t window,button_binding *binding)

{
  toggle_modifiers *ptVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  ushort *local_38;
  uint16_t *mask;
  toggle_modifiers *modifiers;
  button_binding *binding_local;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  uVar2 = 0x1054a8;
  xcb_ungrab_button(state->xcb,binding->button,window,binding->modifiers,in_R8,in_R9,0x1054a8);
  ptVar1 = state->button_state->modifiers;
  if (ptVar1 != (toggle_modifiers *)0x0) {
    for (local_38 = ptVar1->masks; *local_38 != 0; local_38 = local_38 + 1) {
      xcb_ungrab_button(state->xcb,binding->button,window,binding->modifiers | *local_38,in_R8,in_R9
                        ,uVar2);
    }
  }
  return;
}

Assistant:

void button_binding_ungrab(const struct natwm_state *state, xcb_window_t window,
                           const struct button_binding *binding)
{
        xcb_ungrab_button(state->xcb, binding->button, window, binding->modifiers);

        struct toggle_modifiers *modifiers = state->button_state->modifiers;

        if (modifiers == NULL) {
                return;
        }

        for (uint16_t *mask = modifiers->masks; *mask != XCB_NONE; ++mask) {
                xcb_ungrab_button(state->xcb, binding->button, window, binding->modifiers | *mask);
        }
}